

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QDBusSignature * qvariant_cast<QDBusSignature>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  Private *in_RDI;
  long in_FS_OFFSET;
  QDBusSignature *t;
  QMetaType targetType;
  QDBusSignature *in_stack_ffffffffffffffa8;
  Private *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QDBusSignature>();
  QVariant::Private::type(this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    QVariant::Private::get<QDBusSignature>((Private *)0x13ea31);
    QDBusSignature::QDBusSignature((QDBusSignature *)this,in_stack_ffffffffffffffa8);
  }
  else {
    (this->data).shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&this->data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&this->data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    QDBusSignature::QDBusSignature(in_stack_ffffffffffffffa8);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0x13ea8b);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar3.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDBusSignature *)in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}